

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

MOJOSHADER_glEffect * MOJOSHADER_glCompileEffect(MOJOSHADER_effect *effect)

{
  GLuint GVar1;
  MOJOSHADER_malloc p_Var2;
  MOJOSHADER_free p_Var3;
  void *pvVar4;
  MOJOSHADER_effectObject *pMVar5;
  int iVar6;
  MOJOSHADER_glEffect *pMVar7;
  MOJOSHADER_glShader *pMVar8;
  uint *puVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  GLuint shader;
  GLuint local_4c;
  ulong local_48;
  MOJOSHADER_free local_40;
  void *local_38;
  
  p_Var2 = effect->malloc;
  p_Var3 = effect->free;
  pvVar4 = effect->malloc_data;
  local_4c = 0;
  pMVar7 = (MOJOSHADER_glEffect *)(*p_Var2)(0x58,pvVar4);
  if (pMVar7 != (MOJOSHADER_glEffect *)0x0) {
    pMVar7->current_vert_raw = (MOJOSHADER_effectShader *)0x0;
    pMVar7->current_frag_raw = (MOJOSHADER_effectShader *)0x0;
    pMVar7->current_vert = (MOJOSHADER_glShader *)0x0;
    pMVar7->current_frag = (MOJOSHADER_glShader *)0x0;
    *(undefined8 *)&pMVar7->num_preshaders = 0;
    pMVar7->preshader_indices = (uint *)0x0;
    pMVar7->shaders = (MOJOSHADER_glShader *)0x0;
    pMVar7->shader_indices = (uint *)0x0;
    pMVar7->effect = (MOJOSHADER_effect *)0x0;
    *(undefined8 *)&pMVar7->num_shaders = 0;
    pMVar7->prev_program = (MOJOSHADER_glProgram *)0x0;
    iVar13 = effect->object_count;
    if (0 < (long)iVar13) {
      pMVar5 = effect->objects;
      lVar11 = 0;
      do {
        if (*(int *)((long)pMVar5 + lVar11) - 0xfU < 2) {
          puVar9 = &pMVar7->num_shaders;
          if (*(int *)((long)pMVar5 + lVar11 + 0xc) != 0) {
            puVar9 = &pMVar7->num_preshaders;
          }
          *puVar9 = *puVar9 + 1;
        }
        lVar11 = lVar11 + 0x48;
      } while ((long)iVar13 * 0x48 != lVar11);
    }
    pMVar8 = (MOJOSHADER_glShader *)(*p_Var2)(pMVar7->num_shaders << 4,pvVar4);
    pMVar7->shaders = pMVar8;
    if (pMVar8 != (MOJOSHADER_glShader *)0x0) {
      memset(pMVar8,0,(ulong)pMVar7->num_shaders << 4);
      puVar9 = (uint *)(*p_Var2)(pMVar7->num_shaders << 2,pvVar4);
      pMVar7->shader_indices = puVar9;
      if (puVar9 == (uint *)0x0) {
        pMVar8 = pMVar7->shaders;
      }
      else {
        memset(puVar9,0,(ulong)pMVar7->num_shaders << 2);
        if (pMVar7->num_preshaders == 0) {
LAB_001298b3:
          if (0 < effect->object_count) {
            lVar11 = 0;
            lVar12 = 0x40;
            local_48 = 0;
            iVar13 = 0;
            local_40 = p_Var3;
            local_38 = pvVar4;
            do {
              pMVar5 = effect->objects;
              if (*(int *)((long)pMVar5 + lVar12 + -0x40) - 0xfU < 2) {
                if (*(int *)((long)pMVar5 + lVar12 + -0x34) == 0) {
                  iVar6 = (*ctx->profileCompileShader)
                                    (*(MOJOSHADER_parseData **)((long)pMVar5 + lVar12),&local_4c);
                  if (iVar6 != 0) {
                    pMVar8 = pMVar7->shaders;
                    iVar6 = (int)local_48;
                    pMVar8[iVar6].parseData = *(MOJOSHADER_parseData **)((long)pMVar5 + lVar12);
                    pMVar8[iVar6].handle = local_4c;
                    pMVar8[iVar6].refcount = 1;
                    pMVar7->shader_indices[iVar6] = (uint)lVar11;
                    local_48 = (ulong)(iVar6 + 1);
                    goto LAB_0012995e;
                  }
                  iVar6 = 8;
                }
                else {
                  lVar10 = (long)iVar13;
                  iVar13 = iVar13 + 1;
                  pMVar7->preshader_indices[lVar10] = (uint)lVar11;
                  iVar6 = 7;
                }
              }
              else {
LAB_0012995e:
                iVar6 = 0;
              }
              pvVar4 = local_38;
              if ((iVar6 != 0) && (iVar6 != 7)) {
                if (iVar6 == 8) {
                  if (pMVar7->num_shaders != 0) {
                    lVar11 = 8;
                    uVar14 = 0;
                    do {
                      GVar1 = *(GLuint *)((long)&pMVar7->shaders->parseData + lVar11);
                      if (GVar1 != 0) {
                        (*ctx->profileDeleteShader)(GVar1);
                      }
                      uVar14 = uVar14 + 1;
                      lVar11 = lVar11 + 0x10;
                    } while (uVar14 < pMVar7->num_shaders);
                  }
                  p_Var3 = local_40;
                  (*local_40)(pMVar7->shader_indices,pvVar4);
                  (*p_Var3)(pMVar7->shaders,pvVar4);
                  (*p_Var3)(pMVar7,pvVar4);
                  return (MOJOSHADER_glEffect *)0x0;
                }
                return pMVar7;
              }
              lVar11 = lVar11 + 1;
              lVar12 = lVar12 + 0x48;
            } while (lVar11 < effect->object_count);
          }
          pMVar7->effect = effect;
          return pMVar7;
        }
        puVar9 = (uint *)(*p_Var2)(pMVar7->num_preshaders << 2,pvVar4);
        pMVar7->preshader_indices = puVar9;
        if (puVar9 != (uint *)0x0) {
          memset(puVar9,0,(ulong)pMVar7->num_preshaders << 2);
          goto LAB_001298b3;
        }
        (*p_Var3)(pMVar7->shaders,pvVar4);
        pMVar8 = (MOJOSHADER_glShader *)pMVar7->shader_indices;
      }
      (*p_Var3)(pMVar8,pvVar4);
    }
    (*p_Var3)(pMVar7,pvVar4);
  }
  builtin_strncpy(error_buffer,"out of memory",0xe);
  return (MOJOSHADER_glEffect *)0x0;
}

Assistant:

MOJOSHADER_glEffect *MOJOSHADER_glCompileEffect(MOJOSHADER_effect *effect)
{
    int i;
    MOJOSHADER_malloc m = effect->malloc;
    MOJOSHADER_free f = effect->free;
    void *d = effect->malloc_data;
    int current_shader = 0;
    int current_preshader = 0;
    GLuint shader = 0;

    MOJOSHADER_glEffect *retval = (MOJOSHADER_glEffect *) m(sizeof (MOJOSHADER_glEffect), d);
    if (retval == NULL)
    {
        out_of_memory();
        return NULL;
    } // if
    memset(retval, '\0', sizeof (MOJOSHADER_glEffect));

    // Count the number of shaders before allocating
    for (i = 0; i < effect->object_count; i++)
    {
        MOJOSHADER_effectObject *object = &effect->objects[i];
        if (object->type == MOJOSHADER_SYMTYPE_PIXELSHADER
         || object->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)
        {
            if (object->shader.is_preshader)
                retval->num_preshaders++;
            else
                retval->num_shaders++;
        } // if
    } // for

    // Alloc shader information
    retval->shaders = (MOJOSHADER_glShader *) m(retval->num_shaders * sizeof (MOJOSHADER_glShader), d);
    if (retval->shaders == NULL)
    {
        f(retval, d);
        out_of_memory();
        return NULL;
    } // if
    memset(retval->shaders, '\0', retval->num_shaders * sizeof (MOJOSHADER_glShader));
    retval->shader_indices = (unsigned int *) m(retval->num_shaders * sizeof (unsigned int), d);
    if (retval->shader_indices == NULL)
    {
        f(retval->shaders, d);
        f(retval, d);
        out_of_memory();
        return NULL;
    } // if
    memset(retval->shader_indices, '\0', retval->num_shaders * sizeof (unsigned int));

    // Alloc preshader information
    if (retval->num_preshaders > 0)
    {
        retval->preshader_indices = (unsigned int *) m(retval->num_preshaders * sizeof (unsigned int), d);
        if (retval->preshader_indices == NULL)
        {
            f(retval->shaders, d);
            f(retval->shader_indices, d);
            f(retval, d);
            out_of_memory();
            return NULL;
        } // if
        memset(retval->preshader_indices, '\0', retval->num_preshaders * sizeof (unsigned int));
    } // if

    // Run through the shaders again, compiling and tracking the object indices
    for (i = 0; i < effect->object_count; i++)
    {
        MOJOSHADER_effectObject *object = &effect->objects[i];
        if (object->type == MOJOSHADER_SYMTYPE_PIXELSHADER
         || object->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)
        {
            if (object->shader.is_preshader)
            {
                retval->preshader_indices[current_preshader++] = i;
                continue;
            } // if
            if (!ctx->profileCompileShader(object->shader.shader, &shader))
                goto compile_shader_fail;
            retval->shaders[current_shader].parseData = object->shader.shader;
            retval->shaders[current_shader].handle = shader;
            retval->shaders[current_shader].refcount = 1;
            retval->shader_indices[current_shader] = i;
            current_shader++;
        } // if
    } // for

    retval->effect = effect;
    return retval;

compile_shader_fail:
    for (i = 0; i < retval->num_shaders; i++)
        if (retval->shaders[i].handle != 0)
            ctx->profileDeleteShader(retval->shaders[i].handle);
    f(retval->shader_indices, d);
    f(retval->shaders, d);
    f(retval, d);
    return NULL;
}